

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadHead(ReadData *this,BUFF *socketdata,uchar *buff)

{
  uchar *puVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  uchar in_R10B;
  uchar uVar8;
  uchar in_R11B;
  
  lVar7 = (long)socketdata->pos;
  iVar6 = socketdata->pos + 0x1a;
  while( true ) {
    uVar8 = in_R10B;
    if (socketdata->len <= lVar7) {
      return 0;
    }
    puVar1 = socketdata->buff + lVar7;
    if (*puVar1 == '\x12' && (uVar8 == 'D' && in_R11B == 0xaa)) break;
    lVar7 = lVar7 + 1;
    iVar6 = iVar6 + 1;
    in_R10B = *puVar1;
    in_R11B = uVar8;
  }
  uVar3 = *(undefined8 *)(socketdata->buff + lVar7 + 1 + 8);
  uVar4 = *(undefined8 *)(socketdata->buff + lVar7 + 10);
  uVar5 = *(undefined8 *)(socketdata->buff + lVar7 + 10 + 8);
  *(undefined8 *)buff = *(undefined8 *)(socketdata->buff + lVar7 + 1);
  *(undefined8 *)(buff + 8) = uVar3;
  *(undefined8 *)(buff + 9) = uVar4;
  *(undefined8 *)(buff + 0x11) = uVar5;
  uVar2 = *(ushort *)(buff + 1);
  (this->Head).MessageID = (uint)uVar2;
  (this->Head).MessageLength = (uint)*(ushort *)(buff + 5);
  (this->Head).TimeStatus = (uint)buff[10];
  if (uVar2 == 0x2b) {
    (this->Head).GPST.Week = (uint)*(ushort *)(buff + 0xb);
    (this->Head).GPST.SOW = (double)*(int *)(buff + 0xd) / 1000.0;
  }
  (this->Head).HealthFlag = *(uint *)(buff + 0x11) & 1;
  socketdata->pos = socketdata->pos + iVar6;
  return 0;
}

Assistant:

int ReadData::ReadHead(BUFF &socketdata, unsigned char* buff) {
    unsigned char HeadFlag[3];
    for(int i = socketdata.pos; i < socketdata.len; ++i) {
        HeadFlag[2] = socketdata.buff[i];
        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }        
        memcpy(buff, socketdata.buff + i + 1, 25);

        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
            socketdata.pos += i + 25 + 1;
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    return 0;
}